

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *v2m,bool has_degen)

{
  int *piVar1;
  Alloc *pAVar2;
  int n;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  size_t sVar5;
  Reals RVar6;
  Write<double> out;
  LOs ev2v;
  type f;
  Write<double> local_b8;
  Write<double> local_a0;
  Alloc *local_90;
  element_type *local_88;
  type local_80;
  Alloc *local_38;
  
  pAVar2 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar5 = pAVar2->size;
  }
  else {
    sVar5 = (ulong)pAVar2 >> 3;
  }
  local_80.a2e.write_.shared_alloc_.alloc = (Alloc *)&local_80.ev2v;
  local_38 = (Alloc *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  n = (int)(sVar5 >> 2);
  Write<double>::Write(&local_b8,n * 3,(string *)&local_80);
  if (local_80.a2e.write_.shared_alloc_.alloc != (Alloc *)&local_80.ev2v) {
    operator_delete(local_80.a2e.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_80.ev2v.write_.shared_alloc_.alloc)->size + 1));
  }
  Mesh::ask_verts_of((Mesh *)&local_90,(Int)mesh);
  pAVar2 = local_38;
  local_80.a2e.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)local_80.a2e.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.a2e.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.a2e.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.a2e.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.a2e.write_.shared_alloc_.alloc)->use_count =
           (local_80.a2e.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.a2e.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
  local_80.ev2v.write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.ev2v.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_80.ev2v.write_.shared_alloc_.direct_ptr = local_88;
  local_80.v2m.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_80.v2m.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.v2m.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.v2m.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.v2m.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.v2m.write_.shared_alloc_.alloc)->use_count =
           (local_80.v2m.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.v2m.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  local_80.out.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_80.out.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.out.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
  local_80.has_degen = has_degen;
  parallel_for<Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::_lambda(int)_1_>
            (n,&local_80,"get_mident_metrics");
  local_a0.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
  local_a0.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
  if ((((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
       local_b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + -1;
    local_a0.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_b8.shared_alloc_.alloc = (Alloc *)0x0;
  local_b8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)pAVar2,&local_a0);
  pAVar3 = local_a0.shared_alloc_.alloc;
  if (((ulong)local_a0.shared_alloc_.alloc & 7) == 0 && local_a0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_80);
  pvVar4 = extraout_RDX;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar1 = &local_90->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(local_90,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar3 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = pAVar2;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics_tmpl(
    Mesh* mesh, LOs a2e, Reals v2m, bool has_degen) {
  auto na = a2e.size();
  Write<Real> out(na * symm_ncomps(mdim));
  auto ev2v = mesh->ask_verts_of(edim);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    auto ms = gather_symms<edim + 1, mdim>(v2m, v);
    auto m = average_metric(ms, has_degen);
    set_symm(out, a, m);
  };
  parallel_for(na, f, "get_mident_metrics");
  return out;
}